

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

uint * Cec_ManSimSimRef(Cec_ManSim_t *p,int i)

{
  uint uVar1;
  uint *puVar2;
  Gia_Obj_t *pObj;
  uint *local_28;
  uint *pSim;
  int i_local;
  Cec_ManSim_t *p_local;
  
  if (p->pSimInfo[i] != 0) {
    __assert_fail("p->pSimInfo[i] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                  ,0x197,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
  }
  if (p->MemFree == 0) {
    if (p->nWordsAlloc == 0) {
      if (p->pMems != (uint *)0x0) {
        __assert_fail("p->pMems == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                      ,0x19c,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
      }
      p->nWordsAlloc = 0x20000;
      p->nMems = 1;
    }
    p->nWordsAlloc = p->nWordsAlloc << 1;
    if (p->pMems == (uint *)0x0) {
      local_28 = (uint *)malloc((long)p->nWordsAlloc << 2);
    }
    else {
      local_28 = (uint *)realloc(p->pMems,(long)p->nWordsAlloc << 2);
    }
    p->pMems = local_28;
    Cec_ManSimMemRelink(p);
  }
  p->pSimInfo[i] = p->MemFree;
  puVar2 = p->pMems + p->MemFree;
  p->MemFree = *puVar2;
  pObj = Gia_ManObj(p->pAig,i);
  uVar1 = Gia_ObjValue(pObj);
  *puVar2 = uVar1;
  p->nMems = p->nMems + 1;
  if (p->nMemsMax < p->nMems) {
    p->nMemsMax = p->nMems;
  }
  return puVar2;
}

Assistant:

unsigned * Cec_ManSimSimRef( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] == 0 );
    if ( p->MemFree == 0 )
    {
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        Cec_ManSimMemRelink( p );
    }
    p->pSimInfo[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = Gia_ObjValue( Gia_ManObj(p->pAig, i) );
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}